

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::DefineGroupNode::AnnotatePass3
          (DefineGroupNode *this,Compiler *compiler,CountDomain accumConsumes,
          CharSet<char16_t> *accumFollow,bool accumFollowIrrefutable,bool accumFollowEOL)

{
  ThreadContext *this_00;
  bool accumFollowEOL_local;
  bool accumFollowIrrefutable_local;
  CharSet<char16_t> *accumFollow_local;
  Compiler *compiler_local;
  DefineGroupNode *this_local;
  CountDomain accumConsumes_local;
  
  this_00 = Js::ScriptContext::GetThreadContext(compiler->scriptContext);
  ThreadContext::ProbeStackNoDispose(this_00,0x6000,compiler->scriptContext,(PVOID)0x0);
  (this->super_Node).followConsumes = accumConsumes;
  (this->super_Node).followSet = accumFollow;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xfffffffb | (uint)accumFollowIrrefutable << 2;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xfffffeff | (uint)accumFollowEOL << 8;
  (*this->body->_vptr_Node[9])
            (this->body,compiler,accumConsumes,accumFollow,(ulong)accumFollowIrrefutable,
             (ulong)accumFollowEOL);
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xffffbfff |
       (*(uint *)&this->body->field_0xc >> 0xe & 1) << 0xe;
  return;
}

Assistant:

void DefineGroupNode::AnnotatePass3(Compiler& compiler, CountDomain accumConsumes, CharSet<Char>* accumFollow, bool accumFollowIrrefutable, bool accumFollowEOL)
    {
        PROBE_STACK_NO_DISPOSE(compiler.scriptContext, Js::Constants::MinStackRegex);

        followConsumes = accumConsumes;
        followSet = accumFollow;
        isFollowIrrefutable = accumFollowIrrefutable;
        isFollowEOL = accumFollowEOL;
        body->AnnotatePass3(compiler, accumConsumes, accumFollow, accumFollowIrrefutable, accumFollowEOL);

        hasInitialHardFailBOI = body->hasInitialHardFailBOI;
    }